

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put_data.hpp
# Opt level: O0

void __thiscall libtorrent::dht::put_data_observer::~put_data_observer(put_data_observer *this)

{
  put_data_observer *this_local;
  
  ~put_data_observer(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

put_data_observer(
		std::shared_ptr<traversal_algorithm> algorithm
		, udp::endpoint const& ep, node_id const& id, std::string token)
		: traversal_observer(std::move(algorithm), ep, id)
		, m_token(std::move(token))
	{
	}